

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableViewCell::mouseReleaseEvent(TableViewCell *this,QMouseEvent *e)

{
  MouseButton MVar1;
  TableViewCellPrivate *pTVar2;
  QMouseEvent *e_local;
  TableViewCell *this_local;
  
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  if ((MVar1 == LeftButton) &&
     (pTVar2 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
               ::operator->(&this->d), (pTVar2->clicked & 1U) != 0)) {
    pTVar2 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    pTVar2->clicked = false;
    pTVar2 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    if ((pTVar2->highlightOnClick & 1U) != 0) {
      QWidget::update();
    }
  }
  QEvent::ignore((QEvent *)e);
  return;
}

Assistant:

void
TableViewCell::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton && d->clicked )
	{
		d->clicked = false;

		if( d->highlightOnClick )
			update();
	}

	e->ignore();
}